

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall
md::Code::movem(Code *this,vector<md::DataRegister,_std::allocator<md::DataRegister>_> *data_regs,
               vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *addr_regs,
               bool direction_storage,AddressRegister *destination,Size size)

{
  pointer pDVar1;
  pointer pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000009;
  undefined2 uVar6;
  uint uVar7;
  const_iterator __end2;
  const_iterator __begin2;
  pointer pDVar8;
  pointer pAVar9;
  uchar local_3c;
  uchar local_3b;
  uchar local_3a;
  uchar local_39;
  int local_38;
  Size local_34;
  
  local_34 = size;
  local_38 = (**(destination->super_Register).super_Param._vptr_Param)(destination);
  pDVar8 = (data_regs->super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (data_regs->super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = 0;
  if ((int)CONCAT71(in_register_00000009,direction_storage) == 0) {
    for (; pDVar8 != pDVar1; pDVar8 = pDVar8 + 1) {
      uVar4 = (**(pDVar8->super_Register).super_Param._vptr_Param)(pDVar8);
      uVar7 = uVar7 | 1 << (uVar4 & 0x1f);
    }
    pAVar2 = (addr_regs->
             super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar3 = 0x18;
    uVar4 = 0x4c80;
    for (pAVar9 = (addr_regs->
                  super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>).
                  _M_impl.super__Vector_impl_data._M_start; uVar6 = (undefined2)uVar7,
        pAVar9 != pAVar2; pAVar9 = pAVar9 + 1) {
      iVar5 = (**(pAVar9->super_Register).super_Param._vptr_Param)(pAVar9);
      uVar7 = uVar7 | 0x100 << ((byte)iVar5 & 0x1f);
    }
  }
  else {
    for (; pDVar8 != pDVar1; pDVar8 = pDVar8 + 1) {
      iVar3 = (**(pDVar8->super_Register).super_Param._vptr_Param)(pDVar8);
      uVar7 = uVar7 | 0x8000U >> ((byte)iVar3 & 0x1f);
    }
    pAVar2 = (addr_regs->
             super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar3 = 0x20;
    uVar4 = 0x4880;
    for (pAVar9 = (addr_regs->
                  super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>).
                  _M_impl.super__Vector_impl_data._M_start; uVar6 = (undefined2)uVar7,
        pAVar9 != pAVar2; pAVar9 = pAVar9 + 1) {
      iVar5 = (**(pAVar9->super_Register).super_Param._vptr_Param)(pAVar9);
      uVar7 = uVar7 | 0x80U >> ((byte)iVar5 & 0x1f);
    }
  }
  iVar3 = (iVar3 + local_38 & 0xffU) + (uVar4 | (uint)(local_34 == LONG) << 6);
  local_3c = (uchar)((uint)iVar3 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_3c);
  local_3a = (uchar)iVar3;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_3a);
  local_3b = (uchar)((ushort)uVar6 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_3b);
  local_39 = (uchar)uVar6;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_39);
  return this;
}

Assistant:

Code& Code::movem(const std::vector<DataRegister>& data_regs, const std::vector<AddressRegister>& addr_regs, bool direction_storage, const AddressRegister& destination, md::Size size)
{
    uint8_t size_bit = (size == md::Size::LONG) ? 1 : 0;
    uint8_t direction_bit = (direction_storage) ? 0 : 1;

    uint8_t dest_m = (direction_storage) ? 0x4 : 0x3;
    uint8_t dest_xn = destination.getXn();
    uint8_t dest_mxn = (dest_m << 3) + dest_xn;

    uint16_t registersToStore = 0x0000;
    if(direction_storage)
    {
        for(const DataRegister& r : data_regs)
            registersToStore |= (0x8000 >> r.getXn());
        for(const AddressRegister& r : addr_regs)
            registersToStore |= (0x0080 >> r.getXn());
    }
    else
    {
        for (const DataRegister& r : data_regs)
            registersToStore |= (0x0001 << r.getXn());
        for (const AddressRegister& r : addr_regs)
            registersToStore |= (0x0100 << r.getXn());
    }

    uint16_t opcode = 0x4880 + (direction_bit << 10) + (size_bit << 6) + dest_mxn;

    this->add_opcode(opcode);
    this->add_word(registersToStore); // 0xFFFE = D0-D7 and A0-A6
    return *this;
}